

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsNotEqualByNameOnly_Test::~Equality_unitsNotEqualByNameOnly_Test
          (Equality_unitsNotEqualByNameOnly_Test *this)

{
  Equality_unitsNotEqualByNameOnly_Test *this_local;
  
  ~Equality_unitsNotEqualByNameOnly_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByNameOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsB");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_FALSE(libcellml::Units::equivalent(u1, u2));
}